

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int savePPM(char *path,uchar *pixels,uint sx,uint sy)

{
  FILE *__stream;
  ulong __n;
  size_t sVar1;
  uint in_ECX;
  uint in_EDX;
  void *in_RSI;
  char *in_RDI;
  size_t written;
  size_t pixelsLen;
  FILE *fp;
  uint local_4;
  
  __stream = fopen(in_RDI,"wb");
  if (__stream == (FILE *)0x0) {
    local_4 = 0xffffffff;
  }
  else {
    fprintf(__stream,"P6\n%d %d\n255\n",(ulong)in_EDX,(ulong)in_ECX);
    __n = (ulong)(in_EDX * 3 * in_ECX);
    sVar1 = fwrite(in_RSI,1,__n,__stream);
    fclose(__stream);
    local_4 = (uint)(sVar1 != __n);
  }
  return local_4;
}

Assistant:

int savePPM(const char *path, const unsigned char *pixels, const unsigned int sx, const unsigned int sy)
{
    FILE *fp = fopen(path, "wb");
    if (!fp)
        return -1;
    fprintf(fp, "P6\n%d %d\n255\n", sx, sy);
    size_t pixelsLen = 3 * sx * sy;
    size_t written = fwrite(pixels, sizeof pixels[0], pixelsLen, fp);
    fclose(fp);
    return written != pixelsLen;
}